

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11.c
# Opt level: O2

void platform_get_x11_auth(X11Display *disp,Conf *conf)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = getenv("XAUTHORITY");
  pcVar2 = pcVar1;
  if (((pcVar1 != (char *)0x0) ||
      ((pcVar2 = getenv("HOME"), pcVar2 != (char *)0x0 &&
       (pcVar2 = dupcat_fn(pcVar2,"/.Xauthority",0), pcVar2 != (char *)0x0)))) &&
     (x11_get_auth_from_authfile(disp,pcVar2), pcVar1 == (char *)0x0)) {
    safefree(pcVar2);
    return;
  }
  return;
}

Assistant:

void platform_get_x11_auth(struct X11Display *disp, Conf *conf)
{
    char *xauthfile;
    bool needs_free;

    /*
     * Find the .Xauthority file.
     */
    needs_free = false;
    xauthfile = getenv("XAUTHORITY");
    if (!xauthfile) {
        xauthfile = getenv("HOME");
        if (xauthfile) {
            xauthfile = dupcat(xauthfile, "/.Xauthority");
            needs_free = true;
        }
    }

    if (xauthfile) {
        x11_get_auth_from_authfile(disp, xauthfile);
        if (needs_free)
            sfree(xauthfile);
    }
}